

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_word_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
assert_word_matcher<boost::xpressive::detail::word_boundary<mpl_::bool_<false>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (assert_word_matcher<boost::xpressive::detail::word_boundary<mpl_::bool_<false>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  
  pbVar1 = (byte *)(state->cur_)._M_current;
  pbVar2 = (byte *)(state->end_)._M_current;
  if (pbVar2 == pbVar1) {
    state->found_partial_match_ = true;
    bVar5 = false;
  }
  else {
    bVar5 = (*(ushort *)this &
            *(ushort *)((long)&(state->context_).traits_[1]._vptr_traits + (ulong)*pbVar1 * 2)) != 0
    ;
  }
  pbVar3 = (byte *)(state->begin_)._M_current;
  if ((pbVar3 == pbVar1) && ((state->flags_).match_prev_avail_ != true)) {
    bVar6 = false;
  }
  else {
    bVar6 = (*(ushort *)this &
            *(ushort *)((long)&(state->context_).traits_[1]._vptr_traits + (ulong)pbVar1[-1] * 2))
            != 0;
  }
  if ((pbVar3 != pbVar1) || ((state->flags_).match_not_bow_ == false)) {
    if ((pbVar2 == pbVar1) && ((state->flags_).match_not_eow_ != false)) {
      state->found_partial_match_ = true;
    }
    else if (bVar5 != bVar6) {
      return false;
    }
  }
  iVar4 = (*(next->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._vptr_matchable[2])(next);
  return SUB41(iVar4,0);
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            BidiIter cur = state.cur_;
            bool const thisword = !state.eos() && this->is_word(traits_cast<Traits>(state), *cur);
            bool const prevword = (!state.bos() || state.flags_.match_prev_avail_)
                && this->is_word(traits_cast<Traits>(state), *--cur);

            return Cond::eval(prevword, thisword, state) && next.match(state);
        }